

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O1

bool __thiscall ON_OBSOLETE_V5_Leader::Transform(ON_OBSOLETE_V5_Leader *this,ON_Xform *xform)

{
  uint c;
  ON_2dPoint *pOVar1;
  ON_3dPoint p;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  ON_Plane *pOVar7;
  ON_Plane *pOVar8;
  ulong uVar9;
  ON_Plane *this_00;
  byte bVar10;
  ON_2dVector OVar11;
  ON_2dPoint q2;
  ON_2dPointArray q;
  ON_3dPoint P;
  ON_Plane plane;
  ON_2dVector local_160;
  ON_2dPoint local_150;
  ulong local_140;
  ON_Plane *local_138;
  ON_OBSOLETE_V5_Leader *local_130;
  ON_3dPoint local_128;
  double local_110;
  double local_108;
  ON_SimpleArray<ON_2dPoint> local_100;
  double local_e8;
  double dStack_e0;
  double local_d8;
  ON_3dPoint local_c8;
  ON_Plane local_b0;
  
  bVar10 = 0;
  bVar2 = ON_Xform::IsIdentity(xform,0.0);
  if (!bVar2) {
    this_00 = &(this->super_ON_OBSOLETE_V5_Annotation).m_plane;
    pOVar7 = this_00;
    pOVar8 = &local_b0;
    for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pOVar8->origin).x = (pOVar7->origin).x;
      pOVar7 = (ON_Plane *)((long)pOVar7 + (ulong)bVar10 * -0x10 + 8);
      pOVar8 = (ON_Plane *)((long)pOVar8 + (ulong)bVar10 * -0x10 + 8);
    }
    bVar2 = ON_Plane::Transform(&local_b0,xform);
    if (bVar2) {
      c = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_count;
      ON_2dPointArray::ON_2dPointArray((ON_2dPointArray *)&local_100,c);
      bVar4 = false;
      uVar6 = (ulong)c;
      if (bVar2 && 0 < (int)c) {
        lVar5 = 8;
        uVar9 = 1;
        bVar4 = false;
        local_140 = (ulong)c;
        local_138 = this_00;
        local_130 = this;
        do {
          pOVar1 = (local_130->super_ON_OBSOLETE_V5_Annotation).m_points.
                   super_ON_SimpleArray<ON_2dPoint>.m_a;
          local_110 = *(double *)((long)pOVar1 + lVar5 + -8);
          local_108 = *(double *)((long)&pOVar1->x + lVar5);
          ON_Plane::PointAt(&local_128,local_138,local_110,local_108);
          local_c8.z = local_128.z;
          local_c8.x = local_128.x;
          local_c8.y = local_128.y;
          ON_Xform::operator*(&local_128,xform,&local_c8);
          local_d8 = local_128.z;
          local_e8 = local_128.x;
          dStack_e0 = local_128.y;
          p.y = local_128.y;
          p.x = local_128.x;
          p.z = local_128.z;
          bVar3 = ON_Plane::ClosestPointTo(&local_b0,p,&local_150.x,&local_150.y);
          if (!bVar3) {
            bVar2 = false;
          }
          bVar3 = true;
          if (ABS(local_110 - local_150.x) <= 1.490116119385e-08) {
            local_150.x = local_110;
            bVar3 = bVar4;
          }
          bVar4 = true;
          if (ABS(local_108 - local_150.y) <= 1.490116119385e-08) {
            local_150.y = local_108;
            bVar4 = bVar3;
          }
          ON_SimpleArray<ON_2dPoint>::Append(&local_100,&local_150);
          uVar6 = local_140;
          this = local_130;
          this_00 = local_138;
          if (local_140 <= uVar9) break;
          lVar5 = lVar5 + 0x10;
          uVar9 = uVar9 + 1;
        } while (bVar2 != false);
      }
      if (bVar2 != false) {
        ON_Geometry::Transform((ON_Geometry *)this,xform);
        pOVar7 = &local_b0;
        pOVar8 = this_00;
        for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
          (pOVar8->origin).x = (pOVar7->origin).x;
          pOVar7 = (ON_Plane *)((long)pOVar7 + ((ulong)bVar10 * -2 + 1) * 8);
          pOVar8 = (ON_Plane *)((long)pOVar8 + (ulong)bVar10 * -0x10 + 8);
        }
        if (bVar4) {
          ON_2dPointArray::operator=
                    (&(this->super_ON_OBSOLETE_V5_Annotation).m_points,(ON_2dPointArray *)&local_100
                    );
        }
        pOVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.
                 m_a;
        if ((((pOVar1->x != 0.0) || (NAN(pOVar1->x))) || (pOVar1->y != 0.0)) || (NAN(pOVar1->y))) {
          ON_2dVector::ON_2dVector(&local_160,pOVar1);
          bVar4 = ON_2dVector::IsZero(&local_160);
          if (!bVar4) {
            ON_Plane::PointAt(&local_128,this_00,local_160.x,local_160.y);
            (this_00->origin).z = local_128.z;
            (this_00->origin).x = local_128.x;
            (this_00->origin).y = local_128.y;
            ON_Plane::UpdateEquation(this_00);
            OVar11 = ON_2dVector::operator-(&local_160);
            local_160.y = OVar11.y;
            local_160.x = OVar11.x;
            if (1 < (int)uVar6) {
              lVar5 = 0x10;
              do {
                ON_2dPoint::operator+=
                          ((ON_2dPoint *)
                           ((long)&((this->super_ON_OBSOLETE_V5_Annotation).m_points.
                                    super_ON_SimpleArray<ON_2dPoint>.m_a)->x + lVar5),&local_160);
                lVar5 = lVar5 + 0x10;
              } while (uVar6 * 0x10 != lVar5);
            }
            ON_2dPoint::Set((this->super_ON_OBSOLETE_V5_Annotation).m_points.
                            super_ON_SimpleArray<ON_2dPoint>.m_a,0.0,0.0);
          }
        }
      }
      ON_SimpleArray<ON_2dPoint>::~ON_SimpleArray(&local_100);
    }
    ON_Plane::~ON_Plane(&local_b0);
  }
  return bVar2;
}

Assistant:

bool ON_OBSOLETE_V5_Leader::Transform( const ON_Xform& xform )
{
  bool rc = xform.IsIdentity();
  if ( !rc)
  {
    ON_Plane plane = m_plane;
    rc = plane.Transform(xform);
    if ( rc )
    {
      int i;
      const int point_count =  m_points.Count();
      ON_2dPointArray q(point_count);
      ON_2dPoint p2, q2;
      ON_3dPoint P, Q;
      bool bUpdatePoints = false;
      for ( i = 0; i < point_count && rc; i++ )
      {
        p2 = m_points[i];
        P = m_plane.PointAt( p2.x, p2.y );
        Q = xform*P;
        if( !plane.ClosestPointTo(Q,&q2.x,&q2.y) )
          rc = false;
        if ( fabs(p2.x - q2.x) <= ON_SQRT_EPSILON )
          q2.x = p2.x;
        else
          bUpdatePoints = true;
        if ( fabs(p2.y - q2.y) <= ON_SQRT_EPSILON )
          q2.y = p2.y;
        else
          bUpdatePoints = true;
        q.Append(q2);
      }

      if(rc)
      {
        ON_Geometry::Transform(xform);
        m_plane = plane;

        if ( bUpdatePoints )
          m_points = q;

        if ( m_points[0].x != 0.0 || m_points[0].y != 0.0 )
        {
          ON_2dVector v = m_points[0];
          if ( !v.IsZero() )
          {
            m_plane.origin = m_plane.PointAt(v.x,v.y);
            m_plane.UpdateEquation();
            v = -v;
            for ( i = 1; i < point_count; i++ )
            {
              m_points[i] += v;
            }
            m_points[0].Set(0.0,0.0);
          }
        }
      }
    }
  }
  return rc;
}